

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo(nk_context *ctx,char **items,int count,int selected,int item_height,nk_vec2 size)

{
  nk_vec2 nVar1;
  int iVar2;
  nk_vec2 nVar3;
  float local_5c;
  float fStack_4c;
  nk_vec2 window_padding;
  nk_vec2 item_spacing;
  int local_38;
  int max_height;
  int i;
  int item_height_local;
  int selected_local;
  int count_local;
  char **items_local;
  nk_context *ctx_local;
  float fStack_10;
  nk_vec2 size_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x616d,
                  "int nk_combo(struct nk_context *, const char **, int, int, int, struct nk_vec2)")
    ;
  }
  if (items == (char **)0x0) {
    __assert_fail("items",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x616e,
                  "int nk_combo(struct nk_context *, const char **, int, int, int, struct nk_vec2)")
    ;
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x616f,
                  "int nk_combo(struct nk_context *, const char **, int, int, int, struct nk_vec2)")
    ;
  }
  size_local.x = (float)selected;
  if (((ctx != (nk_context *)0x0) && (items != (char **)0x0)) && (count != 0)) {
    nVar1 = (ctx->style).window.spacing;
    nVar3 = nk_panel_get_padding(&ctx->style,ctx->current->layout->type);
    window_padding.y = nVar1.y;
    fStack_4c = nVar3.y;
    iVar2 = (int)window_padding.y * 2 + (int)fStack_4c * 2 +
            count * item_height + count * (int)window_padding.y;
    fStack_10 = size.y;
    if ((float)iVar2 <= fStack_10) {
      local_5c = (float)iVar2;
    }
    else {
      local_5c = fStack_10;
    }
    ctx_local._4_4_ = size.x;
    fStack_10 = local_5c;
    iVar2 = nk_combo_begin_label(ctx,items[selected],stack0xffffffffffffffec);
    i = selected;
    if (iVar2 != 0) {
      nk_layout_row_dynamic(ctx,(float)item_height,1);
      for (local_38 = 0; local_38 < count; local_38 = local_38 + 1) {
        iVar2 = nk_combo_item_label(ctx,items[local_38],0x11);
        if (iVar2 != 0) {
          i = local_38;
        }
      }
      nk_combo_end(ctx);
    }
    size_local.x = (float)i;
  }
  return (int)size_local.x;
}

Assistant:

NK_API int
nk_combo(struct nk_context *ctx, const char **items, int count,
    int selected, int item_height, struct nk_vec2 size)
{
    int i = 0;
    int max_height;
    struct nk_vec2 item_spacing;
    struct nk_vec2 window_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(items);
    NK_ASSERT(ctx->current);
    if (!ctx || !items ||!count)
        return selected;

    item_spacing = ctx->style.window.spacing;
    window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
    max_height = count * item_height + count * (int)item_spacing.y;
    max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
    size.y = NK_MIN(size.y, (float)max_height);
    if (nk_combo_begin_label(ctx, items[selected], size)) {
        nk_layout_row_dynamic(ctx, (float)item_height, 1);
        for (i = 0; i < count; ++i) {
            if (nk_combo_item_label(ctx, items[i], NK_TEXT_LEFT))
                selected = i;
        }
        nk_combo_end(ctx);
    }
    return selected;
}